

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_GenerateResampled(ym3438_t *chip,Bit32s *buf)

{
  Bit32u local_28;
  int local_24;
  Bit32u mute;
  Bit32s buffer [2];
  Bit32u i;
  Bit32s *buf_local;
  ym3438_t *chip_local;
  
  unique0x1000050d = buf;
  while (chip->rateratio <= chip->samplecnt) {
    chip->oldsamples[0] = chip->samples[0];
    chip->oldsamples[1] = chip->samples[1];
    chip->samples[1] = 0;
    chip->samples[0] = 0;
    for (buffer[0] = 0; (uint)buffer[0] < 0x18; buffer[0] = buffer[0] + 1) {
      switch(chip->cycles >> 2) {
      case 0:
        local_28 = chip->mute[1];
        break;
      case 1:
        local_28 = chip->mute[(int)(chip->dacen + 5)];
        break;
      case 2:
        local_28 = chip->mute[3];
        break;
      case 3:
        local_28 = chip->mute[0];
        break;
      case 4:
        local_28 = chip->mute[4];
        break;
      case 5:
        local_28 = chip->mute[2];
        break;
      default:
        local_28 = 0;
      }
      NOPN2_Clock(chip,&local_24);
      if (local_28 == 0) {
        chip->samples[0] = local_24 + chip->samples[0];
        chip->samples[1] = mute + chip->samples[1];
      }
      while ((chip->writebuf[chip->writebuf_cur].time <= chip->writebuf_samplecnt &&
             ((chip->writebuf[chip->writebuf_cur].port & 4) != 0))) {
        chip->writebuf[chip->writebuf_cur].port = chip->writebuf[chip->writebuf_cur].port & 3;
        NOPN2_Write(chip,(uint)chip->writebuf[chip->writebuf_cur].port,
                    chip->writebuf[chip->writebuf_cur].data);
        chip->writebuf_cur = chip->writebuf_cur + 1 & 0x7ff;
      }
      chip->writebuf_samplecnt = chip->writebuf_samplecnt + 1;
    }
    if (chip->use_filter == 0) {
      chip->samples[0] = chip->samples[0] * 0xb;
      chip->samples[1] = chip->samples[1] * 0xb;
    }
    else {
      chip->samples[0] =
           (int)((double)(chip->samples[0] * 0xc - chip->oldsamples[0]) * 0.48766869871737195 +
                (double)chip->oldsamples[0]);
      chip->samples[1] =
           (int)((double)(chip->samples[1] * 0xc - chip->oldsamples[1]) * 0.48766869871737195 +
                (double)chip->oldsamples[1]);
    }
    chip->samplecnt = chip->samplecnt - chip->rateratio;
  }
  *stack0xffffffffffffffe8 =
       (chip->oldsamples[0] * (chip->rateratio - chip->samplecnt) +
       chip->samples[0] * chip->samplecnt) / chip->rateratio;
  stack0xffffffffffffffe8[1] =
       (chip->oldsamples[1] * (chip->rateratio - chip->samplecnt) +
       chip->samples[1] * chip->samplecnt) / chip->rateratio;
  chip->samplecnt = chip->samplecnt + 0x400;
  return;
}

Assistant:

void NOPN2_GenerateResampled(ym3438_t *chip, Bit32s *buf)
{
    Bit32u i;
    Bit32s buffer[2];
    Bit32u mute;
    
    while (chip->samplecnt >= chip->rateratio)
    {
        chip->oldsamples[0] = chip->samples[0];
        chip->oldsamples[1] = chip->samples[1];
        chip->samples[0] = chip->samples[1] = 0;
        for (i = 0; i < 24; i++)
        {
            switch (chip->cycles >> 2)
            {
            case 0: // Ch 2
                mute = chip->mute[1];
                break;
            case 1: // Ch 6, DAC
                mute = chip->mute[5 + chip->dacen];
                break;
            case 2: // Ch 4
                mute = chip->mute[3];
                break;
            case 3: // Ch 1
                mute = chip->mute[0];
                break;
            case 4: // Ch 5
                mute = chip->mute[4];
                break;
            case 5: // Ch 3
                mute = chip->mute[2];
                break;
            default:
                mute = 0;
                break;
            }
            NOPN2_Clock(chip, buffer);
            if (!mute)
            {
                chip->samples[0] += buffer[0];
                chip->samples[1] += buffer[1];
            }

            while (chip->writebuf[chip->writebuf_cur].time <= chip->writebuf_samplecnt)
            {
                if (!(chip->writebuf[chip->writebuf_cur].port & 0x04))
                {
                    break;
                }
                chip->writebuf[chip->writebuf_cur].port &= 0x03;
                NOPN2_Write(chip, chip->writebuf[chip->writebuf_cur].port,
                              chip->writebuf[chip->writebuf_cur].data);
                chip->writebuf_cur = (chip->writebuf_cur + 1) % NOPN_WRITEBUF_SIZE;
            }
            chip->writebuf_samplecnt++;
        }
        if(!chip->use_filter)
        {
            chip->samples[0] *= 11;
            chip->samples[1] *= 11;
        }
        else
        {
            chip->samples[0] = chip->oldsamples[0] + FILTER_CUTOFF_I * (chip->samples[0]*(11+1) - chip->oldsamples[0]);
            chip->samples[1] = chip->oldsamples[1] + FILTER_CUTOFF_I * (chip->samples[1]*(11+1) - chip->oldsamples[1]);
        }
        chip->samplecnt -= chip->rateratio;
    }
    buf[0] = (Bit32s)((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[0] * chip->samplecnt) / chip->rateratio);
    buf[1] = (Bit32s)((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[1] * chip->samplecnt) / chip->rateratio);
    chip->samplecnt += 1 << RSM_FRAC;
}